

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ompt_callback.cpp
# Opt level: O3

void __thiscall OmptInterface::target_data_exit_begin(OmptInterface *this,int64_t device_id)

{
  atomic<unsigned_long> aVar1;
  ompt_callback_target_t UNRECOVERED_JUMPTABLE;
  __atomic_base<unsigned_long> *p_Var2;
  ompt_data_t *poVar3;
  
  aVar1.super___atomic_base<unsigned_long>._M_i =
       ompt_target_region_id_ticket.super___atomic_base<unsigned_long>._M_i;
  if (ompt_enabled == 1) {
    LOCK();
    ompt_target_region_id_ticket.super___atomic_base<unsigned_long>._M_i =
         (__atomic_base<unsigned_long>)
         ((long)ompt_target_region_id_ticket.super___atomic_base<unsigned_long>._M_i + 1);
    UNLOCK();
    p_Var2 = (__atomic_base<unsigned_long> *)__tls_get_addr(&PTR_0010ff80);
    p_Var2->_M_i = (__int_type)aVar1.super___atomic_base<unsigned_long>._M_i;
    UNRECOVERED_JUMPTABLE = ompt_callback_target_fn;
    if ((ompt_callback_target_fn != (ompt_callback_target_t)0x0 & ompt_enabled) == 1) {
      poVar3 = (*ompt_get_task_data_fn)();
      (*UNRECOVERED_JUMPTABLE)
                (ompt_target_exit_data,ompt_scope_begin,(int)device_id,poVar3,p_Var2->_M_i,
                 this->_codeptr_ra);
      return;
    }
  }
  return;
}

Assistant:

uint64_t OmptInterface::target_region_begin() {
  uint64_t retval = 0;
  if (ompt_enabled) {
    ompt_target_region_id = ompt_target_region_id_ticket.fetch_add(1);
    retval = ompt_target_region_id;
    DP("in OmptInterface::target_region_begin (retval = %lu)\n", retval);
  } 
  return retval;
}